

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_dump_codec(opj_codec_t *p_codec,OPJ_INT32 info_flag,FILE *output_stream)

{
  opj_codec_private_t *l_codec;
  FILE *output_stream_local;
  OPJ_INT32 info_flag_local;
  opj_codec_t *p_codec_local;
  
  if (p_codec != (opj_codec_t *)0x0) {
    (*(code *)p_codec[0x13])(p_codec[0xb],info_flag,output_stream);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_dump_codec(opj_codec_t *p_codec,
                                 OPJ_INT32 info_flag,
                                 FILE* output_stream)
{
    if (p_codec) {
        opj_codec_private_t* l_codec = (opj_codec_private_t*) p_codec;

        l_codec->opj_dump_codec(l_codec->m_codec, info_flag, output_stream);
        return;
    }

    /* TODO return error */
    /* fprintf(stderr, "[ERROR] Input parameter of the dump_codec function are incorrect.\n"); */
    return;
}